

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# frm_driver.c
# Opt level: O3

int Wrapping_Not_Necessary_Or_Wrapping_Ok(FORM *form)

{
  FIELD *field;
  _Bool _Var1;
  int iVar2;
  char *txt;
  int iVar3;
  char *buf;
  
  field = form->current;
  if (((field->opts & 0x10) != 0) && ((int)field->rows + field->nrow != 1)) {
    iVar3 = field->drows;
    iVar2 = form->currow;
    _Var1 = Is_There_Room_For_A_Char_In_Line(form);
    if (!_Var1) {
      if (iVar3 + -1 == iVar2) {
        if ((field->status & 8) == 0) {
          return 0;
        }
        _Var1 = Field_Grown(field,1);
        if (!_Var1) {
          return -1;
        }
      }
      buf = form->current->buf + (long)form->currow * (long)form->current->dcols;
      Window_To_Buffer(form->w,field);
      txt = After_Last_Whitespace_Character(buf,field->dcols);
      iVar3 = (int)txt - (int)buf;
      if (0 < iVar3) {
        iVar2 = Insert_String(form,form->currow + 1,txt,field->dcols - iVar3);
        if (iVar2 != 0) {
          wmove(form->w,form->currow,form->curcol);
          wdelch(form->w);
          Window_To_Buffer(form->w,field);
          return -0xc;
        }
        wmove(form->w,form->currow,iVar3);
        wclrtoeol(form->w);
        if (iVar3 <= form->curcol) {
          form->currow = form->currow + 1;
          form->curcol = form->curcol - iVar3;
        }
      }
    }
  }
  return 0;
}

Assistant:

static int Wrapping_Not_Necessary_Or_Wrapping_Ok(FORM * form)
{
  FIELD  *field = form->current;
  int result = E_REQUEST_DENIED;
  bool Last_Row = ((field->drows - 1) == form->currow);

  if ( (field->opts & O_WRAP)                     &&  /* wrapping wanted     */
      (!Single_Line_Field(field))                 &&  /* must be multi-line  */
      (There_Is_No_Room_For_A_Char_In_Line(form)) &&  /* line is full        */
      (!Last_Row || Growable(field))               )  /* there are more lines*/
    {
      char *bp;
      char *split;
      int chars_to_be_wrapped;
      int chars_to_remain_on_line;
      if (Last_Row)
        { /* the above logic already ensures, that in this case the field
             is growable */
          if (!Field_Grown(field,1))
            return E_SYSTEM_ERROR;
        }
      bp = Address_Of_Current_Row_In_Buffer(form);
      Window_To_Buffer(form->w,field);
      split = After_Last_Whitespace_Character(bp,field->dcols);
      /* split points to the first character of the sequence to be brought
         on the next line */
      chars_to_remain_on_line = (int)(split - bp);
      chars_to_be_wrapped     = field->dcols - chars_to_remain_on_line;
      if (chars_to_remain_on_line > 0)
        {
          if ((result=Insert_String(form,form->currow+1,split,
                                    chars_to_be_wrapped)) == E_OK)
            {
              wmove(form->w,form->currow,chars_to_remain_on_line);
              wclrtoeol(form->w);
              if (form->curcol >= chars_to_remain_on_line)
                {
                  form->currow++;
                  form->curcol -= chars_to_remain_on_line;
                }
              return E_OK;
            }
        }
      else
        return E_OK;
      if (result!=E_OK)
        {
          wmove(form->w,form->currow,form->curcol);
          wdelch(form->w);
          Window_To_Buffer(form->w,field);
          result = E_REQUEST_DENIED;
        }
    }
  else
    result = E_OK; /* wrapping was not necessary */
  return(result);
}